

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O2

void __thiscall
nowtech::memory::
PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>::
PoolAllocatorBase(PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
                  *this,size_t aPoolSize,size_t aNodeSize,Occupier *aOccupier)

{
  void **ppvVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  this->mOriginal = this;
  this->mIsOriginal = true;
  this->mOccupier = aOccupier;
  this->mPoolSize = aPoolSize;
  this->mNodeSize = aNodeSize;
  this->mBlockSizeInPointerSize = aNodeSize + 7 >> 3;
  ppvVar1 = (void **)log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier::occupy
                               (aOccupier,(aPoolSize + 1) * (aNodeSize + 7 & 0xfffffffffffffff8));
  this->mMemory = ppvVar1;
  this->mFirst = ppvVar1;
  sVar3 = this->mPoolSize;
  lVar4 = this->mBlockSizeInPointerSize * sVar3;
  this->mProhibited = ppvVar1 + lVar4;
  lVar5 = this->mBlockSizeInPointerSize * 8;
  lVar2 = 0;
  while( true ) {
    ppvVar1 = this->mFirst;
    bVar6 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar6) break;
    *(long *)((long)ppvVar1 + lVar2) = (long)ppvVar1 + lVar5 + lVar2;
    lVar2 = lVar2 + lVar5;
  }
  ppvVar1[lVar4] = (void *)0x0;
  return;
}

Assistant:

PoolAllocatorBase(size_t const aPoolSize, size_t aNodeSize, tInterface& aOccupier) noexcept
    : mOriginal(this)
    , mIsOriginal(true)
    , mOccupier(aOccupier)
    , mPoolSize(aPoolSize)
    , mNodeSize(aNodeSize)
    , mBlockSizeInPointerSize((mNodeSize + sizeof(void*) - 1u) / sizeof(void*))
    , mMemory(mOccupier.occupy(mBlockSizeInPointerSize * sizeof(void*) * (mPoolSize + 1u)))
    , mFirst(reinterpret_cast<void**>(mMemory))
    , mProhibited(mFirst + mPoolSize * mBlockSizeInPointerSize) {
    for(size_t i = 0u; i < mPoolSize; ++i) {
      mFirst[i * mBlockSizeInPointerSize] = static_cast<void*>(mFirst + (i + 1u) * mBlockSizeInPointerSize);
    }
    mFirst[mPoolSize * mBlockSizeInPointerSize] = nullptr;
  }